

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver_unix.cpp
# Opt level: O1

void __thiscall QLocalServerPrivate::closeServer(QLocalServerPrivate *this)

{
  QString *pQVar1;
  int __fd;
  QArrayData *pQVar2;
  int iVar3;
  int *piVar4;
  
  if (this->socketNotifier != (QSocketNotifier *)0x0) {
    QSocketNotifier::setEnabled(SUB81(this->socketNotifier,0));
    QObject::deleteLater();
    this->socketNotifier = (QSocketNotifier *)0x0;
  }
  __fd = this->listenSocket;
  if (__fd != -1) {
    do {
      iVar3 = ::close(__fd);
      if (iVar3 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
  }
  this->listenSocket = -1;
  pQVar1 = &this->fullServerName;
  if ((this->fullServerName).d.size != 0) {
    if ((*(long **)&this->field_0x48 != (long *)0x0) && (**(long **)&this->field_0x48 != 0)) {
      QBindingStorage::registerDependency_helper((QUntypedPropertyData *)&this->field_0x40);
    }
    if (((this->socketOptions).super_QPropertyData<QFlags<QLocalServer::SocketOption>_>.val.
         super_QFlagsStorageHelper<QLocalServer::SocketOption,_4>.
         super_QFlagsStorage<QLocalServer::SocketOption>.i & 8) == 0) {
      QFile::remove((QString *)pQVar1);
    }
  }
  if ((this->serverName).d.ptr != (char16_t *)0x0) {
    pQVar2 = &((this->serverName).d.d)->super_QArrayData;
    (this->serverName).d.d = (Data *)0x0;
    (this->serverName).d.ptr = (char16_t *)0x0;
    (this->serverName).d.size = 0;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
  }
  if ((this->fullServerName).d.ptr != (char16_t *)0x0) {
    pQVar2 = &((pQVar1->d).d)->super_QArrayData;
    (pQVar1->d).d = (Data *)0x0;
    (this->fullServerName).d.ptr = (char16_t *)0x0;
    (this->fullServerName).d.size = 0;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
        return;
      }
    }
  }
  return;
}

Assistant:

void QLocalServerPrivate::closeServer()
{
    if (socketNotifier) {
        socketNotifier->setEnabled(false); // Otherwise, closed socket is checked before deleter runs
        socketNotifier->deleteLater();
        socketNotifier = nullptr;
    }

    if (-1 != listenSocket)
        QT_CLOSE(listenSocket);
    listenSocket = -1;

    if (!fullServerName.isEmpty()
        && !optionsForPlatform(socketOptions).testFlag(QLocalServer::AbstractNamespaceOption)) {
        QFile::remove(fullServerName);
    }

    serverName.clear();
    fullServerName.clear();
}